

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O0

void __thiscall PatternModel::moveOrderDown(PatternModel *this)

{
  OrderSwapCmd *this_00;
  QUndoStack *pQVar1;
  QString local_40;
  OrderSwapCmd *local_18;
  OrderSwapCmd *cmd;
  PatternModel *this_local;
  
  cmd = (OrderSwapCmd *)this;
  this_00 = (OrderSwapCmd *)operator_new(0x20);
  OrderSwapCmd::OrderSwapCmd(this_00,this,this->mCursorPattern,this->mCursorPattern + 1);
  local_18 = this_00;
  tr(&local_40,"move order down",(char *)0x0,-1);
  QUndoCommand::setText((QString *)this_00);
  QString::~QString(&local_40);
  pQVar1 = Module::undoStack(this->mModule);
  QUndoStack::push((QUndoCommand *)pQVar1);
  return;
}

Assistant:

void PatternModel::moveOrderDown() {
    auto cmd = new OrderSwapCmd(*this, mCursorPattern, mCursorPattern + 1);
    cmd->setText((tr("move order down")));
    mModule.undoStack()->push(cmd);
}